

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall
Potassco::AspifTextOutput::rule
          (AspifTextOutput *this,Head_t ht,AtomSpan *head,Weight_t bound,WeightLitSpan *lits)

{
  Weight_t WVar1;
  size_t sVar2;
  WeightLit_t *pWVar3;
  AspifTextOutput *pAVar4;
  WeightLit_t *pWVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  long in_RDI;
  Span<Potassco::WeightLit_t> *in_R8;
  WeightLit_t *end_1;
  WeightLit_t *it_1;
  WeightLit_t *end;
  WeightLit_t *it;
  Weight_t max;
  Weight_t min;
  uint32_t top;
  undefined4 in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  AspifTextOutput *in_stack_ffffffffffffff60;
  AspifTextOutput *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  Head_t ht_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff80;
  AtomSpan *in_stack_ffffffffffffff98;
  AspifTextOutput *in_stack_ffffffffffffffa0;
  WeightLit_t *local_58;
  int local_4c;
  int local_48;
  Head_t local_4;
  
  ht_00.val_ = (E)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  sVar2 = size<Potassco::WeightLit_t>(in_R8);
  if (sVar2 == 0) {
    toSpan<int>();
    rule(in_stack_ffffffffffffff68,ht_00,(AtomSpan *)in_stack_ffffffffffffff60,
         (LitSpan *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    in_stack_ffffffffffffff80 = in_RDX;
  }
  push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  Head_t::operator_cast_to_unsigned_int(&local_4);
  push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  push(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x18));
  pWVar3 = begin<Potassco::WeightLit_t>(in_R8);
  local_4c = weight(pWVar3);
  push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  pAVar4 = push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  size<Potassco::WeightLit_t>(in_R8);
  push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  local_58 = begin<Potassco::WeightLit_t>(in_R8);
  pWVar3 = end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x1102bd);
  local_48 = local_4c;
  for (; local_58 != pWVar3; local_58 = local_58 + 1) {
    lit(local_58);
    push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    weight(local_58);
    push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    WVar1 = weight(local_58);
    if (WVar1 < local_48) {
      local_48 = weight(local_58);
    }
    WVar1 = weight(local_58);
    if (local_4c < WVar1) {
      local_4c = weight(local_58);
    }
  }
  if (local_48 == local_4c) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (in_stack_ffffffffffffff80,(size_type)pAVar4);
    push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    pAVar4 = push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    size<Potassco::WeightLit_t>(in_R8);
    push(pAVar4,in_stack_ffffffffffffff5c);
    pWVar3 = begin<Potassco::WeightLit_t>(in_R8);
    pWVar5 = end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x1103eb);
    for (; pWVar3 != pWVar5; pWVar3 = pWVar3 + 1) {
      lit(pWVar3);
      push(pAVar4,in_stack_ffffffffffffff5c);
    }
  }
  return;
}

Assistant:

void AspifTextOutput::rule(Head_t ht, const AtomSpan& head, Weight_t bound, const WeightLitSpan& lits) {
	if (size(lits) == 0) {
		AspifTextOutput::rule(ht, head, toSpan<Lit_t>());
	}
	push(Directive_t::Rule).push(static_cast<uint32_t>(ht)).push(head);
	uint32_t top = static_cast<uint32_t>(data_->directives.size());
	Weight_t min = weight(*begin(lits)), max = min;
	push(Body_t::Sum).push(bound).push(static_cast<uint32_t>(size(lits)));
	for (const WeightLit_t* it = begin(lits), *end = Potassco::end(lits); it != end; ++it) {
		push(Potassco::lit(*it)).push(Potassco::weight(*it));
		if (Potassco::weight(*it) < min) { min = Potassco::weight(*it); }
		if (Potassco::weight(*it) > max) { max = Potassco::weight(*it); }
	}
	if (min == max) {
		data_->directives.resize(top);
		bound = (bound + min-1)/min;
		push(Body_t::Count).push(bound).push(static_cast<uint32_t>(size(lits)));
		for (const WeightLit_t* it = begin(lits), *end = Potassco::end(lits); it != end; ++it) {
			push(Potassco::lit(*it));
		}
	}
}